

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_lextree.c
# Opt level: O2

void fsg_glist_linklist_free(fsg_glist_linklist_t *glist)

{
  fsg_glist_linklist_t *pfVar1;
  
  if (glist != (fsg_glist_linklist_t *)0x0) {
    do {
      if (glist->glist != (glist_t)0x0) {
        glist_free(glist->glist);
      }
      pfVar1 = glist->next;
      ckd_free(glist);
      glist = pfVar1;
    } while (pfVar1 != (fsg_glist_linklist_t *)0x0);
  }
  return;
}

Assistant:

void fsg_glist_linklist_free(fsg_glist_linklist_t *glist)
{
    if (glist) {
        fsg_glist_linklist_t *nxtglist;
        if (glist->glist)
            glist_free(glist->glist);
        nxtglist = glist->next;
        while (nxtglist) {
            ckd_free(glist);
            glist = nxtglist;
            if (glist->glist)
                glist_free(glist->glist);
            nxtglist = glist->next;
        }
        ckd_free(glist);
    }
    return;
}